

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadImm8(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  DecodeStatus DVar9;
  uint64_t Address_00;
  MCInst *in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  byte bVar10;
  byte bVar11;
  _Bool hasV7Ops;
  _Bool hasMP;
  uint64_t featureBits;
  uint add;
  uint imm;
  uint U;
  uint Rt;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  uVar8 = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar4 = fieldFromInstruction_4(in_ESI,9,1);
  uVar5 = fieldFromInstruction_4(in_ESI,0,8);
  uVar6 = fieldFromInstruction_4(in_ESI,9,1);
  Address_00 = ARM_getFeatureBits(in_RDI->csh->mode);
  bVar10 = (Address_00 & 0x8000) != 0;
  bVar11 = (Address_00 & 0x10000000000) != 0;
  uVar7 = uVar2 << 9 | uVar4 << 8 | uVar5;
  if (uVar2 == 0xf) {
    uVar7 = MCInst_getOpcode(in_RDI);
    if (uVar7 == 0x94e) {
      MCInst_setOpcode(in_RDI,0x94f);
    }
    else if (uVar7 == 0x95d) {
      MCInst_setOpcode(in_RDI,0x95e);
    }
    else if (uVar7 == 0x965) {
      MCInst_setOpcode(in_RDI,0x966);
    }
    else if (uVar7 == 0x96d) {
      MCInst_setOpcode(in_RDI,0x96e);
    }
    else if (uVar7 == 0x975) {
      MCInst_setOpcode(in_RDI,0x976);
    }
    else if (uVar7 == 0x9b8) {
      MCInst_setOpcode(in_RDI,0x9b9);
    }
    else {
      if (uVar7 != 0x9bc) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(in_RDI,0x9bd);
    }
    local_4 = DecodeT2LoadLabel((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar8,
                                (uint64_t)in_RCX,(void *)CONCAT44(local_4,uVar2));
  }
  else {
    if (uVar3 == 0xf) {
      uVar8 = MCInst_getOpcode(in_RDI);
      if (uVar8 == 0x95d) {
        if (uVar6 == 0) {
          MCInst_setOpcode(in_RDI,0x9b5);
        }
      }
      else if (uVar8 == 0x965) {
        MCInst_setOpcode(in_RDI,0x9bc);
      }
      else if (uVar8 == 0x96d) {
        return MCDisassembler_Fail;
      }
    }
    uVar8 = MCInst_getOpcode(in_RDI);
    if (uVar8 == 0x9b5) {
      if (((bVar11 & 1) == 0) || ((bVar10 & 1) == 0)) {
        return MCDisassembler_Fail;
      }
    }
    else if (uVar8 != 0x9b8) {
      if (uVar8 == 0x9bc) {
        if ((bVar11 & 1) == 0) {
          return MCDisassembler_Fail;
        }
      }
      else {
        DVar9 = DecodeGPRRegisterClass
                          ((MCInst *)CONCAT44(uVar3,uVar4),uVar7,Address_00,
                           (void *)CONCAT17(bVar10,CONCAT16(bVar11,CONCAT24(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0))));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar9);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
    }
    DVar9 = DecodeT2AddrModeImm8(in_RCX,local_4,CONCAT44(uVar3,uVar4),(void *)CONCAT44(uVar7,uVar6))
    ;
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar9);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2LoadImm8(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 9, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned add = fieldFromInstruction_4(Insn, 9, 1);

	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	imm |= (U << 8);
	imm |= (Rn << 9);
	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi8:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2PLDi8:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi8:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi8:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi8:
				if (!add)
					MCInst_setOpcode(Inst, ARM_t2PLDWi8);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2PLIi8);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi8:
			break;
		case ARM_t2PLIi8:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWi8:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}